

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlEnumerationPtr xmlCreateEnumeration(xmlChar *name)

{
  xmlEnumerationPtr pxVar1;
  xmlChar *pxVar2;
  
  pxVar1 = (xmlEnumerationPtr)(*xmlMalloc)(0x10);
  if (pxVar1 != (xmlEnumerationPtr)0x0) {
    pxVar1->next = (_xmlEnumeration *)0x0;
    pxVar1->name = (xmlChar *)0x0;
    if (name == (xmlChar *)0x0) {
      return pxVar1;
    }
    pxVar2 = xmlStrdup(name);
    pxVar1->name = pxVar2;
    if (pxVar2 != (xmlChar *)0x0) {
      return pxVar1;
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlEnumerationPtr)0x0;
}

Assistant:

xmlEnumerationPtr
xmlCreateEnumeration(const xmlChar *name) {
    xmlEnumerationPtr ret;

    ret = (xmlEnumerationPtr) xmlMalloc(sizeof(xmlEnumeration));
    if (ret == NULL)
        return(NULL);
    memset(ret, 0, sizeof(xmlEnumeration));

    if (name != NULL) {
        ret->name = xmlStrdup(name);
        if (ret->name == NULL) {
            xmlFree(ret);
            return(NULL);
        }
    }

    return(ret);
}